

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  this->m_width = 0;
  this->m_height = 0;
  this->m_pitch = 0;
  this->m_total = 0;
  this->m_comp_flags = 0xf;
  this->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  vector<crnlib::color_quad<unsigned_char,_int>_>::vector(&this->m_pixel_buf);
  return;
}

Assistant:

image() :
            m_width(0),
            m_height(0),
            m_pitch(0),
            m_total(0),
            m_comp_flags(pixel_format_helpers::cDefaultCompFlags),
            m_pPixels(nullptr)
        {
        }